

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_SelectorRangeToString_Test::
FragmentURITest_SelectorRangeToString_Test(FragmentURITest_SelectorRangeToString_Test *this)

{
  FragmentURITest *in_RDI;
  
  FragmentURITest::FragmentURITest(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)&PTR__FragmentURITest_SelectorRangeToString_Test_002173a8;
  return;
}

Assistant:

TEST_F(FragmentURITest, SelectorRangeToString) {
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 0}), "none");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 1}), "0");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 11}), "10");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 2}), "0..1");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 12}), "10..11");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, ktx::RangeEnd}), "all");
}